

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpScanner.cpp
# Opt level: O1

int __thiscall glslang::TPpContext::characterLiteral(TPpContext *this,TPpToken *ppToken)

{
  int iVar1;
  
  ppToken->name[0] = '\0';
  (ppToken->field_3).ival = 0;
  if (((this->parseContext->super_TParseVersions).intermediate)->source != EShSourceHlsl) {
    return 0x27;
  }
  iVar1 = (*(this->inputStack).
            super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
  if (iVar1 != 0x5c) {
    if (iVar1 == 0x27) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"unexpected","\'","");
      return 0x98;
    }
    (ppToken->field_3).ival = iVar1;
    goto LAB_00404132;
  }
  iVar1 = (*(this->inputStack).
            super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
            ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
  if (0x65 < iVar1) {
    switch(iVar1) {
    case 0x6e:
      (ppToken->field_3).ival = 10;
      break;
    case 0x72:
      (ppToken->field_3).ival = 0xd;
      break;
    case 0x74:
      (ppToken->field_3).ival = 9;
      break;
    case 0x76:
      (ppToken->field_3).ival = 0xb;
      break;
    case 0x78:
switchD_00404122_caseD_78:
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"octal and hex sequences not supported","\\","");
      break;
    default:
      if (iVar1 == 0x66) {
        (ppToken->field_3).ival = 0xc;
        break;
      }
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
    case 0x77:
switchD_00404122_caseD_6f:
      (ppToken->field_3).ival = iVar1;
    }
LAB_00404132:
    ppToken->name[0] = *(char *)&ppToken->field_3;
    ppToken->name[1] = '\0';
    iVar1 = (*(this->inputStack).
              super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    if (iVar1 != 0x27) {
      (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
                (this->parseContext,ppToken,"expected","\'","");
      do {
        do {
          iVar1 = (*(this->inputStack).
                    super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
        } while (0x28 < iVar1 + 1U);
      } while ((0x10000000801U >> ((ulong)(iVar1 + 1U) & 0x3f) & 1) == 0);
    }
    return 0x98;
  }
  if (iVar1 == 0x30) goto switchD_00404122_caseD_78;
  if (iVar1 == 0x61) {
    (ppToken->field_3).ival = 7;
    goto LAB_00404132;
  }
  if (iVar1 == 0x62) {
    (ppToken->field_3).ival = 8;
    goto LAB_00404132;
  }
  goto switchD_00404122_caseD_6f;
}

Assistant:

int TPpContext::characterLiteral(TPpToken* ppToken)
{
    ppToken->name[0] = 0;
    ppToken->ival = 0;

    if (parseContext.intermediate.getSource() != EShSourceHlsl) {
        // illegal, except in macro definition, for which case we report the character
        return '\'';
    }

    int ch = getChar();
    switch (ch) {
    case '\'':
        // As empty sequence:  ''
        parseContext.ppError(ppToken->loc, "unexpected", "\'", "");
        return PpAtomConstInt;
    case '\\':
        // As escape sequence:  '\XXX'
        switch (ch = getChar()) {
        case 'a':
            ppToken->ival = 7;
            break;
        case 'b':
            ppToken->ival = 8;
            break;
        case 't':
            ppToken->ival = 9;
            break;
        case 'n':
            ppToken->ival = 10;
            break;
        case 'v':
            ppToken->ival = 11;
            break;
        case 'f':
            ppToken->ival = 12;
            break;
        case 'r':
            ppToken->ival = 13;
            break;
        case 'x':
        case '0':
            parseContext.ppError(ppToken->loc, "octal and hex sequences not supported", "\\", "");
            break;
        default:
            // This catches '\'', '\"', '\?', etc.
            // Also, things like '\C' mean the same thing as 'C'
            // (after the above cases are filtered out).
            ppToken->ival = ch;
            break;
        }
        break;
    default:
        ppToken->ival = ch;
        break;
    }
    ppToken->name[0] = (char)ppToken->ival;
    ppToken->name[1] = '\0';
    ch = getChar();
    if (ch != '\'') {
        parseContext.ppError(ppToken->loc, "expected", "\'", "");
        // Look ahead for a closing '
        do {
            ch = getChar();
        } while (ch != '\'' && ch != EndOfInput && ch != '\n');
    }

    return PpAtomConstInt;
}